

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

sqlite3_pcache_page * pcache1Fetch(sqlite3_pcache *p,uint iKey,int createFlag)

{
  int *piVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  sqlite3_pcache_page *psVar5;
  PgHdr1 *pPVar6;
  PCache1 *pCache;
  
  psVar5 = *(sqlite3_pcache_page **)
            (*(long *)(p + 0x38) + ((ulong)iKey % (ulong)*(uint *)(p + 0x30)) * 8);
  while( true ) {
    if (psVar5 == (sqlite3_pcache_page *)0x0) {
      if (createFlag != 0) {
        pPVar6 = pcache1FetchStage2((PCache1 *)p,iKey,createFlag);
        return &pPVar6->page;
      }
      return (sqlite3_pcache_page *)0x0;
    }
    if (*(uint *)&psVar5[1].pBuf == iKey) break;
    psVar5 = (sqlite3_pcache_page *)psVar5[1].pExtra;
  }
  if (*(char *)((long)&psVar5[1].pBuf + 4) != '\0') {
    return psVar5;
  }
  pvVar2 = psVar5[2].pBuf;
  pvVar3 = psVar5[2].pExtra;
  pvVar4 = psVar5[3].pBuf;
  *(void **)((long)pvVar4 + 0x28) = pvVar3;
  *(void **)((long)pvVar3 + 0x30) = pvVar4;
  psVar5[2].pExtra = (void *)0x0;
  psVar5[3].pBuf = (void *)0x0;
  *(undefined1 *)((long)&psVar5[1].pBuf + 4) = 1;
  piVar1 = (int *)((long)pvVar2 + 0x28);
  *piVar1 = *piVar1 + -1;
  return psVar5;
}

Assistant:

static sqlite3_pcache_page *pcache1Fetch(
  sqlite3_pcache *p, 
  unsigned int iKey, 
  int createFlag
){
#if PCACHE1_MIGHT_USE_GROUP_MUTEX || defined(SQLITE_DEBUG)
  PCache1 *pCache = (PCache1 *)p;
#endif

  assert( offsetof(PgHdr1,page)==0 );
  assert( pCache->bPurgeable || createFlag!=1 );
  assert( pCache->bPurgeable || pCache->nMin==0 );
  assert( pCache->bPurgeable==0 || pCache->nMin==10 );
  assert( pCache->nMin==0 || pCache->bPurgeable );
  assert( pCache->nHash>0 );
#if PCACHE1_MIGHT_USE_GROUP_MUTEX
  if( pCache->pGroup->mutex ){
    return (sqlite3_pcache_page*)pcache1FetchWithMutex(p, iKey, createFlag);
  }else
#endif
  {
    return (sqlite3_pcache_page*)pcache1FetchNoMutex(p, iKey, createFlag);
  }
}